

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
UpdId<ot::commissioner::persistent_storage::Network>
          (PersistentStorageJson *this,Network *aNewValue,string *aArrName)

{
  json *this_00;
  value_t vVar1;
  json_value jVar2;
  bool bVar3;
  Status SVar4;
  reference this_01;
  iterator result_2;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  itValue;
  iterator result_1;
  iterator result;
  undefined1 local_108 [8];
  json_value local_100;
  Network *local_f8;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_f0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_d0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_b0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_90;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_70;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_50;
  
  this_00 = &this->mCache;
  local_50.m_object =
       nlohmann::
       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
       ::operator[](this_00,aArrName);
  local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_50.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_begin(&local_50);
  local_70.m_object =
       nlohmann::
       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
       ::operator[](this_00,aArrName);
  local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_70.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_end(&local_70);
  local_f0.m_it.primitive_iterator.m_it = local_50.m_it.primitive_iterator.m_it;
  local_f0.m_it.object_iterator._M_node = local_50.m_it.object_iterator._M_node;
  local_f0.m_it.array_iterator._M_current = local_50.m_it.array_iterator._M_current;
  local_90.m_it.primitive_iterator.m_it = local_70.m_it.primitive_iterator.m_it;
  local_90.m_it.object_iterator._M_node = local_70.m_it.object_iterator._M_node;
  local_90.m_it.array_iterator._M_current = local_70.m_it.array_iterator._M_current;
  local_f0.m_object = local_50.m_object;
  local_90.m_object = local_70.m_object;
  local_f8 = aNewValue;
  bVar3 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_f0,&local_90);
  if (!bVar3) {
    do {
      local_d0.m_object = local_f0.m_object;
      local_d0.m_it.primitive_iterator.m_it = local_f0.m_it.primitive_iterator.m_it;
      local_d0.m_it.object_iterator._M_node = local_f0.m_it.object_iterator._M_node;
      local_d0.m_it.array_iterator._M_current = local_f0.m_it.array_iterator._M_current;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<ot::commissioner::persistent_storage::PersistentStorageJson::UpdId<ot::commissioner::persistent_storage::Network>(ot::commissioner::persistent_storage::Network_const&,std::__cxx11::string)::{lambda(ot::commissioner::persistent_storage::Network_const&)#1}>
              ::operator()((_Iter_pred<ot::commissioner::persistent_storage::PersistentStorageJson::UpdId<ot::commissioner::persistent_storage::Network>(ot::commissioner::persistent_storage::Network_const&,std::__cxx11::string)::_lambda(ot::commissioner::persistent_storage::Network_const&)_1_>
                            *)&local_f8,&local_d0);
      if (bVar3) break;
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&local_f0);
      bVar3 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==(&local_f0,&local_90);
    } while (!bVar3);
  }
  local_b0.m_object = local_f0.m_object;
  local_b0.m_it.object_iterator._M_node = local_f0.m_it.object_iterator._M_node;
  local_b0.m_it.array_iterator._M_current = local_f0.m_it.array_iterator._M_current;
  local_b0.m_it.primitive_iterator.m_it = local_f0.m_it.primitive_iterator.m_it;
  local_d0.m_object =
       nlohmann::
       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
       ::operator[](this_00,aArrName);
  local_d0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_d0.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_d0.m_it.primitive_iterator.m_it = -0x8000000000000000;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_end(&local_d0);
  bVar3 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_b0,&local_d0);
  SVar4 = kNotFound;
  if (!bVar3) {
    local_108[0] = null;
    local_100.object = (object_t *)0x0;
    to_json((json *)local_108,aNewValue);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((json *)local_108);
    this_01 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator*(&local_b0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_108);
    vVar1 = this_01->m_type;
    this_01->m_type = local_108[0];
    jVar2 = this_01->m_value;
    this_01->m_value = local_100;
    local_108[0] = vVar1;
    local_100 = jVar2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant(this_01);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_108);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_108 + 8),local_108[0]);
    SVar4 = CacheToFile(this);
  }
  return SVar4;
}

Assistant:

Status UpdId(V const &aNewValue, std::string aArrName)
    {
        auto itValue = std::find_if(std::begin(mCache[aArrName]), std::end(mCache[aArrName]),
                                    [&aNewValue](const V &el) { return el.mId.mId == aNewValue.mId.mId; });
        if (itValue == std::end(mCache[aArrName]))
        {
            return Status::kNotFound;
        }

        *itValue = aNewValue;

        return CacheToFile();
    }